

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v7::detail::snprintf_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  long lVar1;
  char cVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  type tVar7;
  type tVar8;
  byte *pbVar9;
  char *pcVar10;
  byte bVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  byte bVar15;
  uint uVar16;
  size_t count;
  ulong uVar17;
  char *__s;
  char format [7];
  
  if (buf->capacity_ <= buf->size_) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                ,0x9c0,"empty buffer");
  }
  uVar14 = 5;
  if (-1 < precision) {
    uVar14 = precision - 1;
  }
  bVar15 = specs._4_1_;
  format[0] = '%';
  if (1 < bVar15) {
    uVar14 = precision;
  }
  uVar16 = specs._4_4_;
  if (bVar15 == 3 && (uVar16 >> 0x14 & 1) != 0) {
    pbVar9 = (byte *)(format + 2);
    format[1] = '#';
  }
  else {
    pbVar9 = (byte *)(format + 1);
  }
  if (-1 < (int)uVar14) {
    pbVar9[0] = 0x2e;
    pbVar9[1] = 0x2a;
    pbVar9 = pbVar9 + 2;
  }
  if (bVar15 == 3) {
    bVar11 = ((uVar16 >> 0x10 & 1) == 0) << 5 | 0x41;
  }
  else {
    bVar11 = (bVar15 == 2) + 0x65;
  }
  *pbVar9 = bVar11;
  pbVar9[1] = 0;
  sVar3 = buf->size_;
LAB_0011974e:
  while( true ) {
    __s = buf->ptr_ + sVar3;
    uVar17 = buf->capacity_ - sVar3;
    if ((int)uVar14 < 0) {
      iVar6 = snprintf(__s,uVar17,format,value);
    }
    else {
      iVar6 = snprintf(__s,uVar17,format,value,(ulong)uVar14);
    }
    if (iVar6 < 0) goto LAB_001197a9;
    tVar7 = to_unsigned<int>(iVar6);
    count = (size_t)tVar7;
    if (count < uVar17) break;
    uVar17 = count + sVar3 + 1;
    if (buf->capacity_ < uVar17) goto LAB_001197b6;
  }
  if (bVar15 == 2) {
    if (precision != 0) {
      uVar17 = 1;
      do {
        lVar13 = uVar17 + (count - 2);
        uVar17 = uVar17 - 1;
      } while ((byte)(__s[lVar13] - 0x30U) < 10);
      tVar8 = to_unsigned<int>(-(int)uVar17);
      memmove(__s + uVar17 + (count - 1),__s + uVar17 + count,(ulong)tVar8);
      buffer<char>::try_resize(buf,(ulong)(tVar7 - 1));
      goto LAB_001198f8;
    }
  }
  else {
    if ((uVar16 & 0xff) != 3) {
      lVar13 = 2;
      do {
        lVar12 = lVar13;
        lVar13 = lVar12 + -1;
      } while (__s[lVar12 + (count - 3)] != 'e');
      lVar1 = count + lVar13;
      cVar2 = __s[lVar1 + -1];
      if ((cVar2 != '+') && (cVar2 != '-')) {
        __assert_fail("sign == \'+\' || sign == \'-\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                      ,0xa0e,
                      "int fmt::detail::snprintf_float(T, int, float_specs, buffer<char> &) [T = double]"
                     );
      }
      iVar5 = (int)lVar13;
      iVar6 = 0;
      pcVar10 = __s + lVar12 + -4 + count;
      do {
        lVar12 = lVar13 + count;
        if (9 < (byte)(__s[lVar12] - 0x30U)) {
          __assert_fail("is_digit(*p)",
                        "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                        ,0xa12,
                        "int fmt::detail::snprintf_float(T, int, float_specs, buffer<char> &) [T = double]"
                       );
        }
        lVar13 = lVar13 + 1;
        iVar6 = iVar6 * 10 + -0x30 + (uint)(byte)__s[lVar12];
      } while (lVar13 != 0);
      iVar4 = -iVar6;
      if (cVar2 != '-') {
        iVar4 = iVar6;
      }
      iVar6 = 0;
      if (lVar1 != 3) {
        iVar6 = (tVar7 - 3) + iVar5;
        do {
          iVar6 = iVar6 + -1;
          cVar2 = *pcVar10;
          pcVar10 = pcVar10 + -1;
        } while (cVar2 == '0');
        tVar7 = to_unsigned<int>(iVar6);
        memmove(__s + 1,__s + 2,(ulong)tVar7);
      }
      tVar7 = to_unsigned<int>(iVar6);
      buffer<char>::try_resize(buf,sVar3 + 1 + (ulong)tVar7);
      uVar17 = (ulong)(uint)(iVar4 - iVar6);
      goto LAB_001198f8;
    }
    count = sVar3 + count;
  }
  buffer<char>::try_resize(buf,count);
  uVar17 = 0;
LAB_001198f8:
  return (int)uVar17;
LAB_001197a9:
  if (buf->capacity_ != 0xffffffffffffffff) {
    uVar17 = buf->capacity_ + 1;
LAB_001197b6:
    (**buf->_vptr_buffer)(buf,uVar17);
  }
  goto LAB_0011974e;
}

Assistant:

int snprintf_float(T value, int precision, float_specs specs,
                   buffer<char>& buf) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  static_assert(!std::is_same<T, float>::value, "");

  // Subtract 1 to account for the difference in precision since we use %e for
  // both general and exponent format.
  if (specs.format == float_format::general ||
      specs.format == float_format::exp)
    precision = (precision >= 0 ? precision : 6) - 1;

  // Build the format string.
  enum { max_format_size = 7 };  // The longest format is "%#.*Le".
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint && specs.format == float_format::hex) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.format != float_format::hex
                      ? (specs.format == float_format::fixed ? 'f' : 'e')
                      : (specs.upper ? 'A' : 'a');
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
#ifdef FMT_FUZZ
    if (precision > 100000)
      throw std::runtime_error(
          "fuzz mode - avoid large allocation inside snprintf");
#endif
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto because of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      // The buffer will grow exponentially.
      buf.try_reserve(buf.capacity() + 1);
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size >= capacity) {
      buf.try_reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
      continue;
    }
    auto is_digit = [](char c) { return c >= '0' && c <= '9'; };
    if (specs.format == float_format::fixed) {
      if (precision == 0) {
        buf.try_resize(size);
        return 0;
      }
      // Find and remove the decimal point.
      auto end = begin + size, p = end;
      do {
        --p;
      } while (is_digit(*p));
      int fraction_size = static_cast<int>(end - p - 1);
      std::memmove(p, p + 1, to_unsigned(fraction_size));
      buf.try_resize(size - 1);
      return -fraction_size;
    }
    if (specs.format == float_format::hex) {
      buf.try_resize(size + offset);
      return 0;
    }
    // Find and parse the exponent.
    auto end = begin + size, exp_pos = end;
    do {
      --exp_pos;
    } while (*exp_pos != 'e');
    char sign = exp_pos[1];
    assert(sign == '+' || sign == '-');
    int exp = 0;
    auto p = exp_pos + 2;  // Skip 'e' and sign.
    do {
      assert(is_digit(*p));
      exp = exp * 10 + (*p++ - '0');
    } while (p != end);
    if (sign == '-') exp = -exp;
    int fraction_size = 0;
    if (exp_pos != begin + 1) {
      // Remove trailing zeros.
      auto fraction_end = exp_pos - 1;
      while (*fraction_end == '0') --fraction_end;
      // Move the fractional part left to get rid of the decimal point.
      fraction_size = static_cast<int>(fraction_end - begin - 1);
      std::memmove(begin + 1, begin + 2, to_unsigned(fraction_size));
    }
    buf.try_resize(to_unsigned(fraction_size) + offset + 1);
    return exp - fraction_size;
  }
}